

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniqueid_linux.c
# Opt level: O3

int UNIQUEID_RESULT_FromString(char *enumAsString,UNIQUEID_RESULT *destination)

{
  int iVar1;
  size_t i;
  long lVar2;
  
  if (destination != (UNIQUEID_RESULT *)0x0 && enumAsString != (char *)0x0) {
    lVar2 = 0;
    do {
      iVar1 = strcmp(enumAsString,UNIQUEID_RESULTStringStorage[lVar2]);
      if (iVar1 == 0) {
        *destination = (UNIQUEID_RESULT)lVar2;
        return 0;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
  return 0xd;
}

Assistant:

UNIQUEID_RESULT UniqueId_Generate(char* uid, size_t len)
{
    UNIQUEID_RESULT result;

    /* Codes_SRS_UNIQUEID_07_002: [If uid is NULL then UniqueId_Generate shall return UNIQUEID_INVALID_ARG] */
    /* Codes_SRS_UNIQUEID_07_003: [If len is less then 37 then UniqueId_Generate shall return UNIQUEID_INVALID_ARG] */
    if (uid == NULL || len < 37)
    {
        result = UNIQUEID_INVALID_ARG;
        LogError("Buffer Size is Null. (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(UNIQUEID_RESULT, result));
    }
    else
    {
        uuid_t uuidVal;
        uuid_generate(uuidVal);

        /* Codes_SRS_UNIQUEID_07_001: [UniqueId_Generate shall create a unique Id 36 character long string.] */
        memset(uid, 0, len);
        uuid_unparse(uuidVal, uid);
        result = UNIQUEID_OK;
    }
    return result;
}